

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

void overview_scan(level *lev,overview_info *oi)

{
  char cVar1;
  boolean bVar2;
  xchar xVar3;
  uint uVar4;
  char local_88 [8];
  boolean seen_shop [80];
  trap *local_30;
  trap *trap;
  int rtyp;
  int rnum;
  int y;
  int x;
  overview_info *oi_local;
  level *lev_local;
  
  memset(local_88,0,0x50);
  memset(oi,0,0x12);
  if (lev != (level *)0x0) {
    for (rtyp = 0; rtyp < 0x15; rtyp = rtyp + 1) {
      for (rnum = 0; rnum < 0x50; rnum = rnum + 1) {
        if (lev->locations[rnum][rtyp].seenv != '\0') {
          switch(*(uint *)(lev->locations[rnum] + rtyp) & 0x3f) {
          case 0xf:
            uVar4 = *(uint *)&lev->locations[rnum][rtyp].field_0x6 >> 0x10 & 0x3f;
            if (((2 < uVar4) &&
                (bVar2 = on_level(&lev->z,&dungeon_topology.d_blackmarket_level), bVar2 == '\0')) &&
               ((cVar1 = lev->rooms[(int)(uVar4 - 3)].rtype, '\x11' < cVar1 &&
                (local_88[(int)uVar4] == '\0')))) {
              local_88[(int)uVar4] = '\x01';
              if (oi->shopcount == '\0') {
                oi->shoptype = cVar1 + -0x12;
              }
              else {
                oi->shoptype = -1;
              }
              oi->shopcount = oi->shopcount + '\x01';
            }
            break;
          case 0x1e:
            oi->trees = oi->trees + '\x01';
            break;
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
            if ((((lev->sstairs).sx == rnum) && ((lev->sstairs).sy == rtyp)) &&
               ((lev->sstairs).tolev.dnum != (lev->z).dnum)) {
              oi->branch = '\x01';
              xVar3 = ledger_no(&(lev->sstairs).tolev);
              if (levels[xVar3] == (level *)0x0) {
                oi->branch_dst_known = '\0';
              }
              else {
                oi->branch_dst_known = '\x01';
                oi->branch_dst = (lev->sstairs).tolev;
              }
            }
            break;
          case 0x26:
            oi->altars = oi->altars + '\x01';
            oi->altaralign =
                 oi->altaralign | (byte)(*(uint *)&lev->locations[rnum][rtyp].field_0x6 >> 4) & 7;
            uVar4 = *(uint *)&lev->locations[rnum][rtyp].field_0x6 >> 0x10 & 0x3f;
            if ((2 < uVar4) && (lev->rooms[(int)(uVar4 - 3)].rtype == '\n')) {
              oi->temples = oi->temples + '\x01';
            }
            break;
          case 0x28:
            oi->thrones = oi->thrones + '\x01';
            break;
          case 0x29:
            oi->magic_chests = oi->magic_chests + '\x01';
            break;
          case 0x2a:
            oi->sinks = oi->sinks + '\x01';
            break;
          case 0x2b:
            oi->fountains = oi->fountains + '\x01';
          }
        }
      }
    }
    for (local_30 = lev->lev_traps; local_30 != (trap *)0x0; local_30 = local_30->ntrap) {
      if ((((byte)local_30->field_0x8 >> 5 & 1) != 0) && ((local_30->field_0x8 & 0x1f) == 0x12)) {
        oi->portal = '\x01';
        xVar3 = ledger_no(&local_30->dst);
        if (levels[xVar3] == (level *)0x0) {
          oi->portal_dst_known = '\0';
        }
        else {
          oi->portal_dst_known = '\x01';
          oi->portal_dst = local_30->dst;
        }
      }
    }
  }
  return;
}

Assistant:

static void overview_scan(const struct level *lev, struct overview_info *oi)
{
	int x, y, rnum, rtyp;
	struct trap *trap;
	boolean seen_shop[MAXNROFROOMS * 2];
	
	memset(seen_shop, 0, sizeof(seen_shop));
	memset(oi, 0, sizeof(struct overview_info));
	if (!lev)
	    return;
	
	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		if (!lev->locations[x][y].seenv)
		    continue;
		
		switch (lev->locations[x][y].mem_bg) {
		    case S_upstair: case S_dnstair:
		    case S_upladder: case S_dnladder:
		    case S_upsstair: case S_dnsstair:
			if (lev->sstairs.sx == x && lev->sstairs.sy == y &&
			    lev->sstairs.tolev.dnum != lev->z.dnum) {
			    oi->branch = TRUE;
			    if (levels[ledger_no(&lev->sstairs.tolev)]) {
				oi->branch_dst_known = TRUE;
				oi->branch_dst = lev->sstairs.tolev;
			    } else {
				oi->branch_dst_known = FALSE;
			    }
			}
			break;
		    
		    case S_fountain:
			oi->fountains++;
			break;
			
		    case S_sink:
			oi->sinks++;
			break;
			
		    case S_throne:
			oi->thrones++; /* don't care about throne rooms */
			break;

		    case S_magic_chest:
			oi->magic_chests++;
			break;

		    case S_altar:
			oi->altars++;
			oi->altaralign |= (lev->locations[x][y].altarmask & AM_MASK);
			rnum = lev->locations[x][y].roomno;
			if (rnum >= ROOMOFFSET &&
			    lev->rooms[rnum - ROOMOFFSET].rtype == TEMPLE)
			    oi->temples++;
			break;
			
		    case S_tree:
			oi->trees++;
			break;
			
		    case S_room:
			rnum = lev->locations[x][y].roomno;
			if (rnum < ROOMOFFSET)
			    break;
			
			/* Black Market implies the shop, so
			 * there's no need to record it here.
			 */
			if (Is_blackmarket(&lev->z))
			    break;
			
			rtyp = lev->rooms[rnum - ROOMOFFSET].rtype;
			if (rtyp >= SHOPBASE && !seen_shop[rnum]) {
			    seen_shop[rnum] = TRUE;
			    if (oi->shopcount == 0)
				oi->shoptype = rtyp - SHOPBASE;
			    else
				oi->shoptype = -1; /* multiple shops */
			    oi->shopcount++;
			}
		}
	    }
	}
	
	/* find the magic portal, if it exists */
	for (trap = lev->lev_traps; trap; trap = trap->ntrap) {
	    if (trap->tseen && trap->ttyp == MAGIC_PORTAL) {
		oi->portal = TRUE;
		if (levels[ledger_no(&trap->dst)]) {
		    oi->portal_dst_known = TRUE;
		    oi->portal_dst = trap->dst;
		} else {
		    oi->portal_dst_known = FALSE;
		}
	    }
	}
}